

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

size_t internal_bulk_free(mstate m,void **array,size_t nelem)

{
  void *pvVar1;
  int iVar2;
  mchunkptr p_00;
  ulong uVar3;
  void **ppvVar4;
  ulong uVar5;
  bool bVar6;
  size_t newsize;
  mchunkptr next;
  void **b;
  size_t psize;
  mchunkptr p;
  void *mem;
  void **fence;
  void **a;
  size_t unfreed;
  size_t nelem_local;
  void **array_local;
  mstate m_local;
  
  if ((m->mflags & 2) != 0) {
    LOCK();
    iVar2 = m->mutex;
    m->mutex = 1;
    UNLOCK();
    if ((iVar2 != 0) && (iVar2 = spin_acquire_lock(&m->mutex), iVar2 != 0)) {
      return 0;
    }
  }
  fence = array;
  do {
    if (fence == array + nelem) {
      if (m->trim_check < m->topsize) {
        sys_trim(m,0);
      }
      if ((m->mflags & 2) != 0) {
        m->mutex = 0;
      }
      return 0;
    }
    pvVar1 = *fence;
    if (pvVar1 != (void *)0x0) {
      p_00 = (mchunkptr)((long)pvVar1 + -0x10);
      uVar3 = *(ulong *)((long)pvVar1 + -8) & 0xfffffffffffffff8;
      *fence = (void *)0x0;
      bVar6 = false;
      if ((mchunkptr)m->least_addr <= p_00) {
        bVar6 = (*(ulong *)((long)pvVar1 + -8) & 3) != 1;
      }
      if (!bVar6) {
        abort();
      }
      ppvVar4 = fence + 1;
      uVar5 = *(ulong *)((long)pvVar1 + -8) & 0xfffffffffffffff8;
      if ((ppvVar4 == array + nelem) || (*ppvVar4 != (void *)((long)&p_00->fd + uVar5))) {
        dispose_chunk(m,p_00,uVar3);
      }
      else {
        uVar3 = (*(ulong *)((long)&p_00->head + uVar5) & 0xfffffffffffffff8) + uVar3;
        *(ulong *)((long)pvVar1 + -8) = *(ulong *)((long)pvVar1 + -8) & 1 | uVar3 | 2;
        *(ulong *)((long)pvVar1 + (uVar3 - 8)) = *(ulong *)((long)pvVar1 + (uVar3 - 8)) | 1;
        *ppvVar4 = pvVar1;
      }
    }
    fence = fence + 1;
  } while( true );
}

Assistant:

static size_t internal_bulk_free(mstate m, void* array[], size_t nelem) {
  size_t unfreed = 0;
  if (!PREACTION(m)) {
    void** a;
    void** fence = &(array[nelem]);
    for (a = array; a != fence; ++a) {
      void* mem = *a;
      if (mem != 0) {
        mchunkptr p = mem2chunk(mem);
        size_t psize = chunksize(p);
#if FOOTERS
        if (get_mstate_for(p) != m) {
          ++unfreed;
          continue;
        }
#endif
        check_inuse_chunk(m, p);
        *a = 0;
        if (RTCHECK(ok_address(m, p) && ok_inuse(p))) {
          void ** b = a + 1; /* try to merge with next chunk */
          mchunkptr next = next_chunk(p);
          if (b != fence && *b == chunk2mem(next)) {
            size_t newsize = chunksize(next) + psize;
            set_inuse(m, p, newsize);
            *b = chunk2mem(p);
          }
          else
            dispose_chunk(m, p, psize);
        }
        else {
          CORRUPTION_ERROR_ACTION(m);
          break;
        }
      }
    }
    if (should_trim(m, m->topsize))
      sys_trim(m, 0);
    POSTACTION(m);
  }
  return unfreed;
}